

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

double __thiscall OpenMD::Polynomial<double>::evaluate(Polynomial<double> *this,double *x)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  double dVar3;
  double local_28;
  
  p_Var2 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_28 = 0.0;
  for (; (_Rb_tree_header *)p_Var2 != &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_parent;
    dVar3 = fastpow<double>(*x,p_Var2[1]._M_color);
    local_28 = local_28 + dVar3 * (double)p_Var1;
  }
  return local_28;
}

Assistant:

Real evaluate(const Real& x) {
      Real result = Real();
      ExponentType exponent;
      CoefficientType coefficient;

      for (iterator i = polyPairMap_.begin(); i != polyPairMap_.end(); ++i) {
        exponent    = i->first;
        coefficient = i->second;
        result += fastpow(x, exponent) * coefficient;
      }

      return result;
    }